

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O2

void __thiscall
bloaty::RangeMapTest_Translation2_Test::TestBody(RangeMapTest_Translation2_Test *this)

{
  RangeMap *this_00;
  RangeMap *this_01;
  RangeMap *other;
  char *expected_predicate_value;
  long lVar1;
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  initializer_list<bloaty::RangeMapTest::Entry> __l_00;
  initializer_list<bloaty::RangeMapTest::Entry> __l_01;
  allocator<char> local_13a;
  allocator<char> local_139;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_138;
  allocator_type local_129;
  AssertHelper local_128;
  AssertionResult gtest_ar_;
  undefined1 local_108 [24];
  string local_f0 [32];
  undefined8 local_d0;
  undefined8 local_c8;
  uint64_t local_c0;
  string local_b8 [32];
  undefined8 local_98;
  undefined8 local_90;
  uint64_t local_88;
  string local_80 [32];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"foo",(allocator<char> *)&gtest_ar_);
  this_00 = &(this->super_RangeMapTest).map_;
  RangeMap::AddRange(this_00,5,5,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"bar",(allocator<char> *)&gtest_ar_);
  RangeMap::AddDualRange(this_00,0x14,5,0x78,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"baz",(allocator<char> *)&gtest_ar_);
  RangeMap::AddRange(this_00,0x19,5,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"quux",(allocator<char> *)&gtest_ar_);
  RangeMap::AddDualRange(this_00,0x1e,5,0x82,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  RangeMapTest::CheckConsistency(&this->super_RangeMapTest);
  local_108._0_8_ = (char *)0x5;
  local_108._8_8_ = 10;
  local_108._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"foo",(allocator<char> *)&local_138);
  local_d0 = 0x14;
  local_c8 = 0x19;
  local_c0 = 0x78;
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"bar",(allocator<char> *)&local_128);
  local_98 = 0x19;
  local_90 = 0x1e;
  local_88 = (this->super_RangeMapTest).kNoTranslation;
  std::__cxx11::string::string<std::allocator<char>>(local_80,"baz",&local_13a);
  local_60 = 0x1e;
  local_58 = 0x23;
  local_50 = 0x82;
  std::__cxx11::string::string<std::allocator<char>>(local_48,"quux",&local_139);
  __l._M_len = 4;
  __l._M_array = (iterator)local_108;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             &gtest_ar_,__l,&local_129);
  RangeMapTest::AssertMainMapEquals
            (&this->super_RangeMapTest,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             &gtest_ar_);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             &gtest_ar_);
  lVar1 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"translate me",(allocator<char> *)&local_138);
  this_01 = &(this->super_RangeMapTest).map2_;
  other = &(this->super_RangeMapTest).map3_;
  expected_predicate_value = (char *)0x0;
  gtest_ar_.success_ =
       RangeMap::AddRangeWithTranslation(this_01,0x14,0xf,(string *)local_108,this_00,false,other);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)local_108);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)&gtest_ar_,
               (AssertionResult *)
               "map2_.AddRangeWithTranslation(20, 15, \"translate me\", map_, false, &map3_)",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
               ,0x16e,(char *)local_108._0_8_);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)local_108);
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    RangeMapTest::CheckConsistency(&this->super_RangeMapTest);
    local_108._0_8_ = (pointer)0x14;
    local_108._8_8_ = 0x19;
    local_108._16_8_ = (this->super_RangeMapTest).kNoTranslation;
    std::__cxx11::string::string<std::allocator<char>>
              (local_f0,"translate me",(allocator<char> *)&local_138);
    local_d0 = 0x19;
    local_c8 = 0x1e;
    local_c0 = (this->super_RangeMapTest).kNoTranslation;
    std::__cxx11::string::string<std::allocator<char>>
              (local_b8,"translate me",(allocator<char> *)&local_128);
    local_98 = 0x1e;
    local_90 = 0x23;
    local_88 = (this->super_RangeMapTest).kNoTranslation;
    std::__cxx11::string::string<std::allocator<char>>(local_80,"translate me",&local_13a);
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)local_108;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_,__l_00,(allocator_type *)&local_139);
    RangeMapTest::AssertMapEquals
              (&this->super_RangeMapTest,this_01,
               (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_);
    lVar1 = 0x88;
    do {
      std::__cxx11::string::~string((string *)(local_108 + lVar1));
      lVar1 = lVar1 + -0x38;
    } while (lVar1 != -0x20);
    local_108._0_8_ = (pointer)0x78;
    local_108._8_8_ = 0x7d;
    local_108._16_8_ = (this->super_RangeMapTest).kNoTranslation;
    std::__cxx11::string::string<std::allocator<char>>
              (local_f0,"translate me",(allocator<char> *)&local_138);
    local_d0 = 0x82;
    local_c8 = 0x87;
    local_c0 = (this->super_RangeMapTest).kNoTranslation;
    std::__cxx11::string::string<std::allocator<char>>
              (local_b8,"translate me",(allocator<char> *)&local_128);
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)local_108;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_,__l_01,(allocator_type *)&local_13a);
    RangeMapTest::AssertMapEquals
              (&this->super_RangeMapTest,other,
               (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_);
    lVar1 = 0x50;
    do {
      std::__cxx11::string::~string((string *)(local_108 + lVar1));
      lVar1 = lVar1 + -0x38;
    } while (lVar1 != -0x20);
  }
  return;
}

Assistant:

TEST_F(RangeMapTest, Translation2) {
  map_.AddRange(5, 5, "foo");
  map_.AddDualRange(20, 5, 120, "bar");
  map_.AddRange(25, 5, "baz");
  map_.AddDualRange(30, 5, 130, "quux");
  CheckConsistency();
  AssertMainMapEquals({
    {5, 10, kNoTranslation, "foo"},
    {20, 25, 120, "bar"},
    {25, 30, kNoTranslation, "baz"},
    {30, 35, 130, "quux"}
  });

  ASSERT_TRUE(map2_.AddRangeWithTranslation(20, 15, "translate me", map_, false,
                                            &map3_));
  CheckConsistency();
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"},
    {25, 30, kNoTranslation, "translate me"},
    {30, 35, kNoTranslation, "translate me"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"},
    {130, 135, kNoTranslation, "translate me"}
  });
}